

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

void stb_reassign(void *new_context,void *ptr)

{
  void **ppvVar1;
  stb__alloc_type sVar2;
  stb__alloc *src_00;
  stb__alloc *s_00;
  void ***pppvVar3;
  stb__nochildren *s_01;
  stb__nochildren *s_1;
  stb__alloc *s;
  stb__alloc_type t;
  stb__alloc *src;
  void *ptr_local;
  void *new_context_local;
  
  src_00 = stb__get_context(new_context);
  sVar2 = stb__identify(ptr);
  if ((sVar2 != STB__alloc) && (sVar2 != STB__nochildren)) {
    __assert_fail("t == STB__alloc || t == STB__nochildren",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0xb87,"void stb_reassign(void *, void *)");
  }
  if (sVar2 == STB__alloc) {
    s_00 = (stb__alloc *)((long)ptr + -0x20);
    *s_00->prevn = *(void **)((long)ptr + -0x10);
    if (*(long *)((long)ptr + -0x10) != 0) {
      ppvVar1 = s_00->prevn;
      pppvVar3 = stb__prevn(*(void **)((long)ptr + -0x10));
      *pppvVar3 = ppvVar1;
    }
    stb__insert_alloc(src_00,s_00);
  }
  else {
    s_01 = (stb__nochildren *)((long)ptr + -0x10);
    **(undefined8 **)((long)ptr + -8) = s_01->next;
    if (s_01->next != (void *)0x0) {
      ppvVar1 = *(void ***)((long)ptr + -8);
      pppvVar3 = stb__prevn(s_01->next);
      *pppvVar3 = ppvVar1;
    }
    stb__insert_nochild(src_00,s_01);
  }
  return;
}

Assistant:

void stb_reassign(void *new_context, void *ptr)
{
   stb__alloc *src = stb__get_context(new_context);

   stb__alloc_type t = stb__identify(ptr);
   assert(t == STB__alloc || t == STB__nochildren);

   if (t == STB__alloc) {
      stb__alloc *s = (stb__alloc *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_alloc(src, s);
   } else {
      stb__nochildren *s = (stb__nochildren *) ptr - 1;

      // unlink from old
      *(s->prevn) = s->next;
      if (s->next)
         *stb__prevn(s->next) = s->prevn;

      stb__insert_nochild(src, s);
   }
}